

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_begin(nk_context *ctx,nk_window *win,nk_vec2 size,int is_clicked,nk_rect header)

{
  float fVar1;
  uint uVar2;
  nk_window *pnVar3;
  nk_rect body_00;
  int iVar4;
  bool bVar5;
  bool bVar6;
  nk_rect local_74;
  nk_hash hash;
  nk_rect body;
  int is_active;
  int is_open;
  nk_window *popup;
  int is_clicked_local;
  nk_window *win_local;
  nk_context *ctx_local;
  float fStack_20;
  nk_rect header_local;
  nk_vec2 size_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5f0c,
                  "int nk_combo_begin(struct nk_context *, struct nk_window *, struct nk_vec2, int, struct nk_rect)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
         (ctx->current->layout == (nk_panel *)0x0)) {
        size_local.x = 0.0;
      }
      else {
        pnVar3 = (win->popup).win;
        ctx_local._4_4_ = header.x;
        header_local.w = size.x;
        fStack_20 = header.y;
        header_local.y = header.h;
        fVar1 = (ctx->style).window.combo_border;
        header_local.h = size.y;
        uVar2 = (win->popup).combo_count;
        (win->popup).combo_count = uVar2 + 1;
        bVar5 = pnVar3 != (nk_window *)0x0;
        bVar6 = false;
        if ((pnVar3 != (nk_window *)0x0) && (bVar6 = false, (win->popup).name == uVar2)) {
          bVar6 = (win->popup).type == NK_PANEL_COMBO;
        }
        if (((((is_clicked != 0) && (bVar5)) && (!bVar6)) || ((bVar5 && (!bVar6)))) ||
           ((!bVar5 && ((!bVar6 && (is_clicked == 0)))))) {
          size_local.x = 0.0;
        }
        else {
          local_74 = header;
          if ((is_clicked != 0) && (bVar5)) {
            local_74 = nk_rect(0.0,0.0,0.0,0.0);
          }
          body_00.y = (fStack_20 + header_local.y) - fVar1;
          body_00.x = ctx_local._4_4_;
          body_00.w = header_local.w;
          body_00.h = header_local.h;
          iVar4 = nk_nonblock_begin(ctx,0,body_00,local_74,NK_PANEL_COMBO);
          if (iVar4 == 0) {
            size_local.x = 0.0;
          }
          else {
            (win->popup).type = NK_PANEL_COMBO;
            (win->popup).name = uVar2;
            size_local.x = 1.4013e-45;
          }
        }
      }
      return (int)size_local.x;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5f0e,
                  "int nk_combo_begin(struct nk_context *, struct nk_window *, struct nk_vec2, int, struct nk_rect)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x5f0d,
                "int nk_combo_begin(struct nk_context *, struct nk_window *, struct nk_vec2, int, struct nk_rect)"
               );
}

Assistant:

NK_INTERN int
nk_combo_begin(struct nk_context *ctx, struct nk_window *win,
    struct nk_vec2 size, int is_clicked, struct nk_rect header)
{
    struct nk_window *popup;
    int is_open = 0;
    int is_active = 0;
    struct nk_rect body;
    nk_hash hash;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    popup = win->popup.win;
    body.x = header.x;
    body.w = size.x;
    body.y = header.y + header.h-ctx->style.window.combo_border;
    body.h = size.y;

    hash = win->popup.combo_count++;
    is_open = (popup) ? nk_true:nk_false;
    is_active = (popup && (win->popup.name == hash) && win->popup.type == NK_PANEL_COMBO);
    if ((is_clicked && is_open && !is_active) || (is_open && !is_active) ||
        (!is_open && !is_active && !is_clicked)) return 0;
    if (!nk_nonblock_begin(ctx, 0, body,
        (is_clicked && is_open)?nk_rect(0,0,0,0):header, NK_PANEL_COMBO)) return 0;

    win->popup.type = NK_PANEL_COMBO;
    win->popup.name = hash;
    return 1;
}